

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O3

void mask_morph(Mat *mask)

{
  Mat dilateElement;
  Mat erodeElement;
  Mat local_e8 [96];
  Mat local_88 [96];
  
  cv::getStructuringElement(local_88,0);
  cv::getStructuringElement(local_e8,0);
  cv::erode();
  cv::erode();
  cv::dilate();
  cv::dilate();
  cv::Mat::~Mat(local_e8);
  cv::Mat::~Mat(local_88);
  return;
}

Assistant:

void mask_morph(Mat &mask) {
    Mat erodeElement = getStructuringElement(MORPH_RECT, Size(3, 3));
    Mat dilateElement = getStructuringElement(MORPH_RECT, Size(8, 8));
    erode(mask, mask, erodeElement);
    erode(mask, mask, erodeElement);
    dilate(mask, mask, dilateElement);
    dilate(mask, mask, dilateElement);
}